

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O1

int handle_pp_identifier(Context_conflict1 *ctx)

{
  IncludeState *pIVar1;
  MOJOSHADER_malloc p_Var2;
  void *pvVar3;
  MOJOSHADER_free p_Var4;
  long lVar5;
  BufferBlock *pBVar6;
  Context_conflict1 *pCVar7;
  uint uVar8;
  int iVar9;
  Token TVar10;
  Define *pDVar11;
  size_t sVar13;
  size_t sVar14;
  BufferBlock *pBVar15;
  Buffer *def;
  uint uVar16;
  long lVar17;
  Buffer *pBVar18;
  Buffer *buffer;
  IncludeState *pIVar19;
  Buffer *pBVar20;
  int iVar21;
  char *pcVar22;
  char *sym;
  char *pcVar23;
  bool bVar24;
  byte bVar25;
  undefined8 uStack_100;
  char local_f8 [104];
  char *local_90;
  Define *local_88;
  int local_7c;
  BufferBlock *local_78;
  int local_6c;
  Buffer *local_68;
  Context_conflict1 *local_60;
  uint local_54;
  ulong local_50;
  Buffer *local_48;
  int local_3c;
  Buffer *local_38;
  size_t sVar12;
  
  bVar25 = 0;
  iVar21 = ctx->recursion_count;
  ctx->recursion_count = iVar21 + 1;
  if (0xff < iVar21) {
    uStack_100 = 0x14bd5d;
    failf(ctx,"%s","Recursing macros");
    return 0;
  }
  pIVar1 = ctx->include_stack;
  pcVar23 = pIVar1->filename;
  uVar8 = pIVar1->line;
  uVar16 = pIVar1->tokenlen;
  lVar5 = -((ulong)(uVar16 + 1) + 0xf & 0xfffffffffffffff0);
  sym = local_f8 + lVar5;
  pcVar22 = pIVar1->token;
  *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bd95;
  memcpy(sym,pcVar22,(ulong)uVar16);
  sym[pIVar1->tokenlen] = '\0';
  local_90 = sym;
  *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bdb0;
  local_88 = find_define(ctx,sym);
  if (local_88 == (Define *)0x0) {
    return 0;
  }
  local_7c = local_88->paramcount;
  if (local_7c == 0) {
    pcVar22 = local_88->definition;
    *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14be0f;
    sVar12 = strlen(pcVar22);
    iVar21 = push_source(ctx,pcVar23,pcVar22,(uint)sVar12,uVar8,(MOJOSHADER_includeClose)0x0);
    return iVar21;
  }
  local_6c = 0;
  if (0 < local_7c) {
    local_6c = local_7c;
  }
  pIVar1 = ctx->include_stack;
  pIVar19 = pIVar1;
  pcVar23 = local_f8;
  for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
    *(char **)pcVar23 = pIVar19->filename;
    pIVar19 = (IncludeState *)((long)pIVar19 + (ulong)bVar25 * -0x10 + 8);
    pcVar23 = pcVar23 + ((ulong)bVar25 * -2 + 1) * 8;
  }
  if (pIVar1->pushedback == 0) {
    *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14be3b;
    TVar10 = preprocessor_lexer(pIVar1);
  }
  else {
    pIVar1->pushedback = 0;
    TVar10 = pIVar1->tokenval;
  }
  if (TVar10 == 0x28) {
    pIVar1->report_whitespace = 1;
    local_50 = 1;
    local_54 = 0;
    local_3c = 0;
    pBVar20 = (Buffer *)0x0;
    local_60 = ctx;
    do {
      ctx = local_60;
      pcVar23 = local_90;
      local_48 = pBVar20;
      if ((int)local_50 < 1) {
        if ((int)local_50 != 0) {
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c6a5;
          __assert_fail("paren == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x5d4,"int handle_macro_args(Context *, const char *, const Define *)");
        }
        if ((((local_7c < 1) && (local_3c == 1)) && (local_54 != 0)) &&
           (local_3c = 0, pBVar20 != (Buffer *)0x0)) {
          *(code **)((long)&uStack_100 + lVar5) = failf;
          __assert_fail("params == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                        ,0x5d9,"int handle_macro_args(Context *, const char *, const Define *)");
        }
        if (local_3c != local_6c) {
          iVar21 = 0;
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c52a;
          failf(ctx,"macro \'%s\' passed %d arguments, but requires %d",pcVar23);
          pBVar20 = local_48;
          goto joined_r0x0014c5d4;
        }
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c2e7;
        local_38 = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
        if (local_38 == (Buffer *)0x0) goto LAB_0014c5cb;
        pIVar19 = ctx->include_stack;
        pcVar23 = pIVar19->filename;
        pcVar22 = local_88->definition;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c312;
        sVar12 = strlen(pcVar22);
        uVar8 = pIVar19->line;
        iVar21 = 0;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c32b;
        iVar9 = push_source(ctx,pcVar23,pcVar22,(uint)sVar12,uVar8,(MOJOSHADER_includeClose)0x0);
        pBVar20 = local_38;
        if (iVar9 == 0) {
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c538;
          buffer_destroy(pBVar20);
          pBVar20 = local_48;
          goto joined_r0x0014c5d4;
        }
        pIVar19 = ctx->include_stack;
        goto LAB_0014c33a;
      }
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14be9c;
      local_38 = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14beb3;
      local_68 = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
      if (pIVar1->pushedback == 0) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bed4;
        TVar10 = preprocessor_lexer(pIVar1);
      }
      else {
        pIVar1->pushedback = 0;
        TVar10 = pIVar1->tokenval;
      }
      pBVar18 = (Buffer *)(ulong)TVar10;
      if (local_54 != 0) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c667;
        __assert_fail("!void_call",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x563,"int handle_macro_args(Context *, const char *, const Define *)");
      }
      do {
        pCVar7 = local_60;
        pBVar20 = local_68;
        pcVar23 = pIVar1->token;
        uVar8 = pIVar1->tokenlen;
        sVar13 = (size_t)uVar8;
        iVar21 = (int)pBVar18;
        pcVar22 = pcVar23;
        if (iVar21 < 0x2c) {
          if (iVar21 == 0x20) {
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bfc4;
            sVar13 = buffer_size(pBVar20);
            pBVar20 = local_38;
            sVar13 = (size_t)(sVar13 != 0);
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bfd7;
            sVar14 = buffer_size(pBVar20);
            uVar8 = (uint)(sVar14 != 0);
            pcVar23 = " ";
            pcVar22 = " ";
          }
          else if (iVar21 == 0x28) {
            local_50 = (ulong)((int)local_50 + 1);
          }
          else if ((iVar21 == 0x29) &&
                  (uVar16 = (int)local_50 - 1, bVar24 = (int)local_50 < 2, local_50 = (ulong)uVar16,
                  bVar24)) {
            pBVar18 = (Buffer *)0x29;
            iVar21 = 6;
            goto LAB_0014c076;
          }
LAB_0014c020:
          pBVar20 = local_38;
          if (pcVar22 == (char *)0x0) {
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c629;
            __assert_fail("expr != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x597,"int handle_macro_args(Context *, const char *, const Define *)");
          }
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c037;
          iVar9 = buffer_append(pBVar20,pcVar22,(ulong)uVar8);
          pBVar20 = local_68;
          iVar21 = 2;
          if (iVar9 != 0) {
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c050;
            iVar9 = buffer_append(pBVar20,pcVar23,sVar13);
            if (iVar9 != 0) {
              if (pIVar1->pushedback == 0) {
                *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c071;
                TVar10 = preprocessor_lexer(pIVar1);
              }
              else {
                pIVar1->pushedback = 0;
                TVar10 = pIVar1->tokenval;
              }
              pBVar18 = (Buffer *)(ulong)TVar10;
              iVar21 = 0;
            }
          }
        }
        else {
          if (iVar21 < 0x11d) {
            if (iVar21 == 0x2c) {
              bVar24 = (int)local_50 == 1;
              if (bVar24) {
                local_50 = 1;
                pBVar18 = (Buffer *)0x2c;
                iVar21 = 6;
                goto LAB_0014c076;
              }
            }
            else if (iVar21 == 0x101) {
              *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bf13;
              pDVar11 = find_define_by_token(pCVar7);
              if ((pDVar11 != (Define *)0x0) && (pDVar11->paramcount == 0)) {
                pcVar22 = pDVar11->definition;
                *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bf32;
                sVar12 = strlen(pcVar22);
                uVar8 = (uint)sVar12;
              }
            }
            goto LAB_0014c020;
          }
          if ((iVar21 != 0x11d) && (iVar21 != 300)) goto LAB_0014c020;
          if (pIVar1->pushedback != 0) goto LAB_0014c629;
          pIVar1->pushedback = 1;
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14bfb0;
          failf(pCVar7,"%s","Unterminated macro list");
          iVar21 = 2;
        }
LAB_0014c076:
        buffer = local_38;
      } while (iVar21 == 0);
      pBVar20 = local_48;
      if (iVar21 == 6) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c09f;
        sVar13 = buffer_size(buffer);
        pBVar18 = local_68;
        if (sVar13 == 0) {
          local_54 = (uint)(local_3c == 0 && (int)local_50 == 0);
        }
        pBVar20 = local_48;
        if (local_3c < local_6c) {
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c0c9;
          sVar13 = buffer_size(pBVar18);
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c0d7;
          local_78 = (BufferBlock *)buffer_flatten(pBVar18);
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c0e3;
          sVar14 = buffer_size(buffer);
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c0ee;
          pBVar15 = (BufferBlock *)buffer_flatten(buffer);
          pCVar7 = local_60;
          def = (Buffer *)local_60->define_pool;
          if (def == (Buffer *)0x0) {
            pvVar3 = local_60->malloc_data;
            p_Var2 = local_60->malloc;
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c133;
            def = (Buffer *)(*p_Var2)(0x30,pvVar3);
            if (def == (Buffer *)0x0) {
              pCVar7->out_of_memory = 1;
            }
          }
          else {
            local_60->define_pool = (Define *)def->f;
          }
          pCVar7 = local_60;
          pBVar6 = local_78;
          if (def != (Buffer *)0x0) {
            def->m = (MOJOSHADER_malloc)0x0;
            def->f = (MOJOSHADER_free)0x0;
            def->tail = (BufferBlock *)0x0;
            def->block_size = 0;
            def->total_bytes = 0;
            def->head = (BufferBlock *)0x0;
          }
          bVar24 = local_78 == (BufferBlock *)0x0;
          if (def == (Buffer *)0x0 || (pBVar15 == (BufferBlock *)0x0 || bVar24)) {
            pvVar3 = local_60->malloc_data;
            p_Var4 = local_60->free;
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c1fa;
            (*p_Var4)(pBVar6,pvVar3);
            pvVar3 = pCVar7->malloc_data;
            p_Var4 = pCVar7->free;
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c20a;
            (*p_Var4)(pBVar15,pvVar3);
            pBVar20 = local_68;
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c213;
            buffer_destroy(pBVar20);
            pBVar20 = local_38;
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c21c;
            buffer_destroy(pBVar20);
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c227;
            free_define(pCVar7,(Define *)def);
            iVar21 = 2;
            pBVar20 = local_48;
          }
          else {
            if (0 < (int)(uint)sVar14) {
              lVar17 = (ulong)((uint)sVar14 & 0x7fffffff) + 1;
              do {
                if (*(char *)((long)pBVar15 + lVar17 + -2) != ' ') break;
                *(char *)((long)pBVar15 + lVar17 + -2) = '\0';
                lVar17 = lVar17 + -1;
              } while (1 < lVar17);
            }
            if (0 < (int)(uint)sVar13) {
              lVar17 = (ulong)((uint)sVar13 & 0x7fffffff) + 1;
              do {
                if (*(char *)((long)local_78 + lVar17 + -2) != ' ') break;
                *(char *)((long)local_78 + lVar17 + -2) = '\0';
                lVar17 = lVar17 + -1;
              } while (1 < lVar17);
            }
            def->total_bytes = (size_t)local_88->parameters[local_3c];
            def->head = pBVar15;
            def->tail = local_78;
            def->f = (MOJOSHADER_free)local_48;
            iVar21 = 0;
            pBVar20 = def;
          }
          pBVar18 = local_38;
          buffer = local_38;
          if (def == (Buffer *)0x0 || (pBVar15 == (BufferBlock *)0x0 || bVar24)) goto LAB_0014c257;
        }
        pBVar18 = pBVar20;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c245;
        buffer_destroy(buffer);
        pBVar20 = local_68;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c24e;
        buffer_destroy(pBVar20);
        local_3c = local_3c + 1;
        iVar21 = 0;
        pBVar20 = pBVar18;
      }
LAB_0014c257:
    } while (iVar21 == 0);
    if (iVar21 != 2) {
      return (int)pBVar18;
    }
    iVar21 = 0;
    ctx = local_60;
  }
  else {
    pcVar23 = local_f8;
    pIVar19 = pIVar1;
    for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
      pIVar19->filename = *(char **)pcVar23;
      pcVar23 = pcVar23 + ((ulong)bVar25 * -2 + 1) * 8;
      pIVar19 = (IncludeState *)((long)pIVar19 + (ulong)bVar25 * -0x10 + 8);
    }
    iVar21 = 0;
    pBVar20 = (Buffer *)0x0;
  }
  goto joined_r0x0014c5d4;
LAB_0014c33a:
  do {
    if (pIVar19->pushedback == 0) {
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c354;
      TVar10 = preprocessor_lexer(pIVar19);
    }
    else {
      pIVar19->pushedback = 0;
      TVar10 = pIVar19->tokenval;
    }
    pBVar20 = local_38;
    if (TVar10 == TOKEN_EOI) {
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c549;
      pcVar23 = buffer_flatten(pBVar20);
      pBVar20 = local_38;
      if (pcVar23 != (char *)0x0) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c55a;
        buffer_destroy(pBVar20);
        ctx = local_60;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c566;
        pop_source(ctx);
        pIVar19 = ctx->include_stack;
        pcVar22 = pIVar19->filename;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c579;
        sVar12 = strlen(pcVar23);
        uVar8 = pIVar19->line;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c598;
        iVar9 = push_source(ctx,pcVar22,pcVar23,(uint)sVar12,uVar8,close_define_include);
        iVar21 = 1;
        pBVar20 = local_48;
        if (iVar9 != 0) goto joined_r0x0014c5d4;
        pvVar3 = ctx->malloc_data;
        p_Var4 = ctx->free;
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c5b4;
        (*p_Var4)(pcVar23,pvVar3);
        goto LAB_0014c5cb;
      }
      break;
    }
    TVar10 = pIVar19->tokenval;
    if (TVar10 == TOKEN_HASHHASH) {
      if (pIVar19->pushedback == 0) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c3af;
        preprocessor_lexer(pIVar19);
      }
      else {
        pIVar19->pushedback = 0;
      }
      if (pIVar19->tokenval == TOKEN_EOI) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c686;
        __assert_fail("state->tokenval != TOKEN_EOI",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x4f6,"int replace_and_push_macro(Context *, const Define *, const Define *)"
                     );
      }
    }
    else {
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c384;
      sVar13 = buffer_size(pBVar20);
      pBVar20 = local_38;
      if (sVar13 != 0) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c39e;
        iVar21 = buffer_append(pBVar20," ",1);
        if (iVar21 == 0) break;
      }
    }
    pBVar20 = local_48;
    pcVar23 = pIVar19->token;
    sVar12 = (size_t)pIVar19->tokenlen;
    if (pIVar19->tokenval == TOKEN_IDENTIFIER) {
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c3f4;
      pDVar11 = find_macro_arg(pIVar19,(Define *)pBVar20);
      if (pDVar11 != (Define *)0x0) {
        lVar17 = 0x10;
        if (TVar10 != TOKEN_HASHHASH) {
          if (pIVar19->pushedback == 0) {
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c4ba;
            TVar10 = preprocessor_lexer(pIVar19);
          }
          else {
            pIVar19->pushedback = 0;
            TVar10 = pIVar19->tokenval;
          }
          if (pIVar19->pushedback != 0) {
LAB_0014c629:
            *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c648;
            __assert_fail("!state->pushedback",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x2d5,"void pushback(IncludeState *)");
          }
          pIVar19->pushedback = 1;
          lVar17 = (ulong)(TVar10 == TOKEN_HASHHASH) * 8 + 8;
        }
        pcVar23 = *(char **)((long)&pDVar11->identifier + lVar17);
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c4ec;
        sVar12 = strlen(pcVar23);
      }
LAB_0014c4ef:
      sVar13 = sVar12 & 0xffffffff;
    }
    else {
      if (pIVar19->tokenval != TOKEN_HASH) goto LAB_0014c4ef;
      if (pIVar19->pushedback == 0) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c433;
        preprocessor_lexer(pIVar19);
      }
      else {
        pIVar19->pushedback = 0;
      }
      pBVar20 = local_38;
      if (pIVar19->tokenval == TOKEN_EOI) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c6c4;
        __assert_fail("state->tokenval != TOKEN_EOI",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x507,"int replace_and_push_macro(Context *, const Define *, const Define *)"
                     );
      }
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c455;
      iVar21 = buffer_append(pBVar20,"\"",1);
      pBVar20 = local_48;
      if (iVar21 == 0) break;
      if (pIVar19->tokenval == TOKEN_IDENTIFIER) {
        *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c472;
        pDVar11 = find_macro_arg(pIVar19,(Define *)pBVar20);
        if (pDVar11 != (Define *)0x0) {
          pcVar23 = pDVar11->original;
          *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c483;
          sVar12 = strlen(pcVar23);
        }
      }
      pBVar20 = local_38;
      *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c495;
      iVar21 = buffer_append(pBVar20,pcVar23,sVar12 & 0xffffffff);
      if (iVar21 == 0) break;
      sVar13 = 1;
      pcVar23 = "\"";
    }
    pBVar20 = local_38;
    *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c4fe;
    iVar21 = buffer_append(pBVar20,pcVar23,sVar13);
  } while (iVar21 != 0);
  ctx = local_60;
  *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c5c2;
  pop_source(ctx);
  pBVar20 = local_38;
  *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c5cb;
  buffer_destroy(pBVar20);
LAB_0014c5cb:
  iVar21 = 0;
  pBVar20 = local_48;
joined_r0x0014c5d4:
  while (pBVar20 != (Buffer *)0x0) {
    pBVar18 = (Buffer *)pBVar20->f;
    pBVar20->total_bytes = 0;
    *(undefined8 *)((long)&uStack_100 + lVar5) = 0x14c5e9;
    free_define(ctx,(Define *)pBVar20);
    pBVar20 = pBVar18;
  }
  pIVar1->report_whitespace = 0;
  return iVar21;
}

Assistant:

static int handle_pp_identifier(Context *ctx)
{
    if (ctx->recursion_count++ >= 256)  // !!! FIXME: gcc can figure this out.
    {
        fail(ctx, "Recursing macros");
        return 0;
    } // if

    IncludeState *state = ctx->include_stack;
    const char *fname = state->filename;
    const unsigned int line = state->line;
    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    // Is this identifier #defined?
    const Define *def = find_define(ctx, sym);
    if (def == NULL)
        return 0;   // just send the token through unchanged.
    else if (def->paramcount != 0)
        return handle_macro_args(ctx, sym, def);

    const size_t deflen = strlen(def->definition);
    return push_source(ctx, fname, def->definition, deflen, line, NULL);
}